

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::SetBlendConstants
          (VulkanCommandBuffer *this,float *BlendConstants)

{
  Char *Message;
  char (*in_RCX) [32];
  undefined1 local_38 [8];
  string msg;
  float *BlendConstants_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = BlendConstants;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"SetBlendConstants",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x1c9);
    std::__cxx11::string::~string((string *)local_38);
  }
  (*vkCmdSetBlendConstants)(this->m_VkCmdBuffer,(float *)msg.field_2._8_8_);
  return;
}

Assistant:

__forceinline void SetBlendConstants(const float BlendConstants[4])
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        vkCmdSetBlendConstants(m_VkCmdBuffer, BlendConstants);
    }